

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O1

void warnf(Configurable *config,char *fmt,...)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  long lVar6;
  char *__s;
  va_list ap;
  char print_buffer [256];
  char local_138 [264];
  
  if (config->mute == false) {
    __s = local_138;
    iVar3 = curl_mvsnprintf(__s,0x100,fmt);
    while (0 < iVar3) {
      fputs("Warning: ",(FILE *)config->errors);
      if (iVar3 < 0x47) {
        fputs(__s,(FILE *)config->errors);
        iVar3 = 0;
      }
      else {
        ppuVar5 = __ctype_b_loc();
        lVar6 = 0x46;
        do {
          lVar1 = lVar6 + -1;
          if (lVar6 == 1) break;
          lVar2 = lVar6 + -1;
          lVar6 = lVar1;
        } while (((*ppuVar5)[(byte)__s[lVar2]] & 0x2000) == 0);
        iVar4 = (int)lVar1;
        if (lVar1 == 0) {
          iVar4 = 0x45;
        }
        fwrite(__s,(long)iVar4 + 1,1,(FILE *)config->errors);
        fputs("\n",(FILE *)config->errors);
        __s = __s + (long)iVar4 + 1;
        iVar3 = iVar3 - iVar4;
      }
    }
  }
  return;
}

Assistant:

void warnf(struct Configurable *config, const char *fmt, ...)
{
  if(!config->mute) {
    va_list ap;
    int len;
    char *ptr;
    char print_buffer[256];

    va_start(ap, fmt);
    len = vsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    va_end(ap);

    ptr = print_buffer;
    while(len > 0) {
      fputs(WARN_PREFIX, config->errors);

      if(len > (int)WARN_TEXTWIDTH) {
        int cut = WARN_TEXTWIDTH-1;

        while(!ISSPACE(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = WARN_TEXTWIDTH-1;

        (void)fwrite(ptr, cut + 1, 1, config->errors);
        fputs("\n", config->errors);
        ptr += cut+1; /* skip the space too */
        len -= cut;
      }
      else {
        fputs(ptr, config->errors);
        len = 0;
      }
    }
  }
}